

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

void __thiscall cmFindPackageCommand::FillPrefixesCMakeSystemVariable(cmFindPackageCommand *this)

{
  long lVar1;
  bool bVar2;
  cmMakefile *pcVar3;
  char *pcVar4;
  bool bVar5;
  bool bVar6;
  __type _Var7;
  mapped_type *this_00;
  cmValue cVar8;
  string *psVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  long lVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string_view arg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expanded;
  long install_prefix_count;
  string debugBuffer;
  string install_path_to_remove;
  cmAlphaNum local_f8;
  long local_c8;
  cmAlphaNum local_c0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  this_00 = std::
            map<cmFindCommon::PathLabel,_cmSearchPath,_std::less<cmFindCommon::PathLabel>,_std::allocator<std::pair<const_cmFindCommon::PathLabel,_cmSearchPath>_>_>
            ::operator[](&(this->super_cmFindCommon).LabeledPaths,
                         &cmFindCommon::PathLabel::CMakeSystem);
  pcVar3 = (this->super_cmFindCommon).Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"CMAKE_FIND_NO_INSTALL_PREFIX",(allocator<char> *)&local_c0);
  bVar5 = cmMakefile::IsOn(pcVar3,(string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  bVar2 = (this->super_cmFindCommon).NoCMakeInstallPath;
  if (bVar2 == false) {
    pcVar3 = (this->super_cmFindCommon).Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"CMAKE_FIND_USE_INSTALL_PREFIX",(allocator<char> *)&local_c0);
    bVar6 = cmMakefile::IsDefinitionSet(pcVar3,(string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
  }
  else {
    bVar6 = false;
  }
  local_c8 = -1;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  pcVar3 = (this->super_cmFindCommon).Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"_CMAKE_SYSTEM_PREFIX_PATH_INSTALL_PREFIX_COUNT",
             (allocator<char> *)&local_c0);
  cVar8 = cmMakefile::GetDefinition(pcVar3,(string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  if (cVar8.Value != (string *)0x0) {
    cmStrToLong(cVar8.Value,&local_c8);
  }
  pcVar3 = (this->super_cmFindCommon).Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"_CMAKE_SYSTEM_PREFIX_PATH_INSTALL_PREFIX_VALUE",
             (allocator<char> *)&local_c0);
  cVar8 = cmMakefile::GetDefinition(pcVar3,(string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  if (cVar8.Value != (string *)0x0) {
    std::__cxx11::string::_M_assign((string *)&local_70);
  }
  if (((bVar2 == false) || (local_c8 < 1 || bVar5)) || (local_70._M_string_length == 0)) {
    if ((bVar5 & bVar6) == 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,"CMAKE_INSTALL_PREFIX",(allocator<char> *)&local_c0);
      cmSearchPath::AddCMakePath(this_00,(string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,"CMAKE_SYSTEM_PREFIX_PATH",(allocator<char> *)&local_c0);
      cmSearchPath::AddCMakePath(this_00,(string *)&local_f8);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,"CMAKE_SYSTEM_PREFIX_PATH",(allocator<char> *)&local_c0);
      cmSearchPath::AddCMakePath(this_00,(string *)&local_f8);
    }
    std::__cxx11::string::~string((string *)&local_f8);
  }
  else {
    pcVar3 = (this->super_cmFindCommon).Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"CMAKE_SYSTEM_PREFIX_PATH",(allocator<char> *)&local_c0);
    psVar9 = (string *)cmMakefile::GetDefinition(pcVar3,(string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    if (psVar9 == (string *)0x0) {
      psVar9 = &cmValue::Empty_abi_cxx11_;
    }
    arg._M_str = (psVar9->_M_dataplus)._M_p;
    arg._M_len = psVar9->_M_string_length;
    cmExpandedList_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_f8,arg,false);
    pcVar4 = local_f8.View_._M_str;
    lVar10 = 0;
    for (__lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_f8.View_._M_len;
        __lhs != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar4;
        __lhs = __lhs + 1) {
      _Var7 = std::operator==(__lhs,&local_70);
      lVar1 = lVar10 + 1;
      if ((!_Var7) || (lVar10 = lVar1, lVar1 != local_c8)) {
        cmSearchPath::AddPath(this_00,__lhs);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_f8);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"CMAKE_SYSTEM_FRAMEWORK_PATH",(allocator<char> *)&local_c0);
  cmSearchPath::AddCMakePath(this_00,(string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"CMAKE_SYSTEM_APPBUNDLE_PATH",(allocator<char> *)&local_c0);
  cmSearchPath::AddCMakePath(this_00,(string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  if ((this->super_cmFindCommon).DebugMode == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,
               "CMake variables defined in the Platform file [CMAKE_FIND_USE_CMAKE_SYSTEM_PATH].\n",
               (allocator<char> *)&local_f8);
    anon_unknown.dwarf_6c61f2::collectPathsForDebug(&local_90,this_00,0);
    local_f8.View_._M_str = (this->DebugBuffer)._M_dataplus._M_p;
    local_f8.View_._M_len = (this->DebugBuffer)._M_string_length;
    local_c0.View_._M_len = local_90._M_string_length;
    local_c0.View_._M_str = local_90._M_dataplus._M_p;
    cmStrCat<>(&local_50,&local_f8,&local_c0);
    std::__cxx11::string::operator=((string *)&this->DebugBuffer,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_90);
  }
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void cmFindPackageCommand::FillPrefixesCMakeSystemVariable()
{
  cmSearchPath& paths = this->LabeledPaths[PathLabel::CMakeSystem];

  const bool install_prefix_in_list =
    !this->Makefile->IsOn("CMAKE_FIND_NO_INSTALL_PREFIX");
  const bool remove_install_prefix = this->NoCMakeInstallPath;
  const bool add_install_prefix = !this->NoCMakeInstallPath &&
    this->Makefile->IsDefinitionSet("CMAKE_FIND_USE_INSTALL_PREFIX");

  // We have 3 possible states for `CMAKE_SYSTEM_PREFIX_PATH` and
  // `CMAKE_INSTALL_PREFIX`.
  // Either we need to remove `CMAKE_INSTALL_PREFIX`, add
  // `CMAKE_INSTALL_PREFIX`, or do nothing.
  //
  // When we need to remove `CMAKE_INSTALL_PREFIX` we remove the Nth occurrence
  // of `CMAKE_INSTALL_PREFIX` from `CMAKE_SYSTEM_PREFIX_PATH`, where `N` is
  // computed by `CMakeSystemSpecificInformation.cmake` while constructing
  // `CMAKE_SYSTEM_PREFIX_PATH`. This ensures that if projects / toolchains
  // have removed `CMAKE_INSTALL_PREFIX` from the list, we don't remove
  // some other entry by mistake
  long install_prefix_count = -1;
  std::string install_path_to_remove;
  if (cmValue to_skip = this->Makefile->GetDefinition(
        "_CMAKE_SYSTEM_PREFIX_PATH_INSTALL_PREFIX_COUNT")) {
    cmStrToLong(to_skip, &install_prefix_count);
  }
  if (cmValue install_value = this->Makefile->GetDefinition(
        "_CMAKE_SYSTEM_PREFIX_PATH_INSTALL_PREFIX_VALUE")) {
    install_path_to_remove = *install_value;
  }

  if (remove_install_prefix && install_prefix_in_list &&
      install_prefix_count > 0 && !install_path_to_remove.empty()) {

    cmValue prefix_paths =
      this->Makefile->GetDefinition("CMAKE_SYSTEM_PREFIX_PATH");
    // remove entry from CMAKE_SYSTEM_PREFIX_PATH
    std::vector<std::string> expanded = cmExpandedList(*prefix_paths);
    long count = 0;
    for (const auto& path : expanded) {
      bool const to_add =
        !(path == install_path_to_remove && ++count == install_prefix_count);
      if (to_add) {
        paths.AddPath(path);
      }
    }
  } else if (add_install_prefix && !install_prefix_in_list) {
    paths.AddCMakePath("CMAKE_INSTALL_PREFIX");
    paths.AddCMakePath("CMAKE_SYSTEM_PREFIX_PATH");
  } else {
    // Otherwise the current setup of `CMAKE_SYSTEM_PREFIX_PATH` is correct
    paths.AddCMakePath("CMAKE_SYSTEM_PREFIX_PATH");
  }

  paths.AddCMakePath("CMAKE_SYSTEM_FRAMEWORK_PATH");
  paths.AddCMakePath("CMAKE_SYSTEM_APPBUNDLE_PATH");

  if (this->DebugMode) {
    std::string debugBuffer = "CMake variables defined in the Platform file "
                              "[CMAKE_FIND_USE_CMAKE_SYSTEM_PATH].\n";
    collectPathsForDebug(debugBuffer, paths);
    this->DebugBuffer = cmStrCat(this->DebugBuffer, debugBuffer);
  }
}